

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logging.cpp
# Opt level: O3

EC_T_BOOL CAtEmLogging::OsDbgMsgHookWrapper(EC_T_CHAR *szFormat,__va_list_tag *vaArgs)

{
  EC_T_BOOL EVar1;
  
  if ((G_pOsDbgMsgLoggingInst != (CAtEmLogging *)0x0) &&
     (EVar1 = OsDbgMsgHook(G_pOsDbgMsgLoggingInst,szFormat,vaArgs), EVar1 == 0)) {
    return 0;
  }
  vprintf(szFormat,vaArgs);
  return 0;
}

Assistant:

EC_T_BOOL CAtEmLogging::OsDbgMsgHookWrapper(const EC_T_CHAR* szFormat, EC_T_VALIST vaArgs)
{
EC_T_BOOL bPrint = EC_TRUE;

    if (EC_NULL != G_pOsDbgMsgLoggingInst)
    {
        bPrint = G_pOsDbgMsgLoggingInst->OsDbgMsgHook(szFormat, vaArgs);
    }
    if (bPrint)
    {
        OsVprintf(szFormat, vaArgs);
    }
    return EC_FALSE;
}